

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGhsMultiGenerator::Generate(cmLocalGhsMultiGenerator *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  pointer ppcVar2;
  cmGhsMultiTargetGenerator tg;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_120;
  cmGhsMultiTargetGenerator local_108;
  
  cmGlobalGenerator::GetLocalGeneratorTargetsInOrder
            (&local_120,(this->super_cmLocalGenerator).GlobalGenerator,&this->super_cmLocalGenerator
            );
  if (local_120.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_120.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ppcVar2 = local_120.
              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      this_00 = *ppcVar2;
      bVar1 = cmGeneratorTarget::IsInBuildSystem(this_00);
      if (bVar1) {
        cmGhsMultiTargetGenerator::cmGhsMultiTargetGenerator(&local_108,this_00);
        cmGhsMultiTargetGenerator::Generate(&local_108);
        cmGhsMultiTargetGenerator::~cmGhsMultiTargetGenerator(&local_108);
      }
      ppcVar2 = ppcVar2 + 1;
    } while (ppcVar2 !=
             local_120.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_120.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_120.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmLocalGhsMultiGenerator::Generate()
{
  for (cmGeneratorTarget* gt :
       this->GlobalGenerator->GetLocalGeneratorTargetsInOrder(this)) {
    if (!gt->IsInBuildSystem()) {
      continue;
    }

    cmGhsMultiTargetGenerator tg(gt);
    tg.Generate();
  }
}